

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  PropertySpecSyntax *pPVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor local_29;
  SyntaxNode *local_28;
  DisableIffSyntax *local_20;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_28 = (SyntaxNode *)0x0;
  }
  else {
    local_28 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_28,
                          (BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x20) == (SyntaxNode *)0x0) {
    local_20 = (DisableIffSyntax *)0x0;
  }
  else {
    local_20 = (DisableIffSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x20),(DeepCloneVisitor *)&local_20,
                          (BumpAllocator *)__child_stack);
  }
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),&local_29,(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PropertySpecSyntax,slang::syntax::TimingControlSyntax*,slang::syntax::DisableIffSyntax*,slang::syntax::PropertyExprSyntax&>
                     ((BumpAllocator *)__child_stack,(TimingControlSyntax **)&local_28,&local_20,
                      (PropertyExprSyntax *)args_2);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PropertySpecSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PropertySpecSyntax>(
        node.clocking ? deepClone(*node.clocking, alloc) : nullptr,
        node.disable ? deepClone(*node.disable, alloc) : nullptr,
        *deepClone<PropertyExprSyntax>(*node.expr, alloc)
    );
}